

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  uint64_t count;
  bool bVar1;
  ostream *poVar2;
  AssertionPrinter *this_00;
  pointer pMVar3;
  undefined8 *in_RDI;
  size_t N;
  const_iterator itEnd;
  ColourGuard *in_stack_ffffffffffffff28;
  ColourGuard *in_stack_ffffffffffffff30;
  pluralise *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  ColourGuard local_80;
  StringRef local_70;
  pluralise local_60 [2];
  uint64_t local_28;
  MessageInfo *local_20;
  MessageInfo *local_18;
  
  local_18 = (MessageInfo *)
             std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        in_stack_ffffffffffffff28);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_ffffffffffffff30,
                     (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_ffffffffffffff28);
  if (!bVar1) {
    local_20 = (MessageInfo *)
               std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::cend
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          in_stack_ffffffffffffff28);
    local_28 = __gnu_cxx::operator-
                         ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                           *)in_stack_ffffffffffffff30,
                          (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                           *)in_stack_ffffffffffffff28);
    ColourImpl::guardColour
              ((ColourImpl *)in_stack_ffffffffffffff38,
               (Code)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    poVar2 = Catch::operator<<((ostream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::operator<<(poVar2," with ");
    count = local_28;
    local_70 = operator____sr((char *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    pluralise::pluralise(local_60,count,local_70);
    this_00 = (AssertionPrinter *)
              Catch::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::operator<<((ostream *)this_00,':');
    ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff30);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      if (((*(byte *)(in_RDI + 4) & 1) == 0) &&
         (pMVar3 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                 *)(in_RDI + 3)), pMVar3->type == Info)) {
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)(in_RDI + 3));
      }
      else {
        printMessage(this_00);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)in_stack_ffffffffffffff30,
                           (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)in_stack_ffffffffffffff28);
        if (bVar1) {
          in_stack_ffffffffffffff28 = (ColourGuard *)*in_RDI;
          in_stack_ffffffffffffff30 = &local_80;
          ColourImpl::guardColour
                    ((ColourImpl *)in_stack_ffffffffffffff38,
                     (Code)((ulong)in_stack_ffffffffffffff30 >> 0x20));
          in_stack_ffffffffffffff38 =
               (pluralise *)
               Catch::operator<<((ostream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          std::operator<<((ostream *)in_stack_ffffffffffffff38," and");
          ColourImpl::ColourGuard::~ColourGuard(in_stack_ffffffffffffff30);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = compactDimColour) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(itEnd - itMessage);

        stream << colourImpl->guardColour( colour ) << " with "
               << pluralise( N, "message"_sr ) << ':';

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    stream << colourImpl->guardColour(compactDimColour) << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }